

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::beginZoneProps
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate startTime,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  UnicodeString *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  undefined1 local_78 [8];
  UnicodeString dstr;
  UDate startTime_local;
  int32_t toOffset_local;
  int32_t fromOffset_local;
  UnicodeString *zonename_local;
  UBool isDst_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  __n = zonename;
  dstr.fUnion._48_8_ = startTime;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    VTZWriter::write(writer,0x3de100,__buf,(size_t)__n);
    VTZWriter::write(writer,0x3a,__buf_00,(size_t)__n);
    if (isDst == '\0') {
      VTZWriter::write(writer,0x3de180,__buf_01,(size_t)__n);
      __buf_02 = extraout_RDX_00;
    }
    else {
      VTZWriter::write(writer,0x3de160,__buf_01,(size_t)__n);
      __buf_02 = extraout_RDX;
    }
    VTZWriter::write(writer,0x3de20e,__buf_02,(size_t)__n);
    UnicodeString::UnicodeString((UnicodeString *)local_78);
    VTZWriter::write(writer,0x3de1e0,__buf_03,(size_t)__n);
    VTZWriter::write(writer,0x3a,__buf_04,(size_t)__n);
    millisToOffset(toOffset,(UnicodeString *)local_78);
    VTZWriter::write(writer,(int)local_78,__buf_05,(size_t)__n);
    VTZWriter::write(writer,0x3de20e,__buf_06,(size_t)__n);
    VTZWriter::write(writer,0x3de1c0,__buf_07,(size_t)__n);
    VTZWriter::write(writer,0x3a,__buf_08,(size_t)__n);
    millisToOffset(fromOffset,(UnicodeString *)local_78);
    VTZWriter::write(writer,(int)local_78,__buf_09,(size_t)__n);
    VTZWriter::write(writer,0x3de20e,__buf_10,(size_t)__n);
    VTZWriter::write(writer,0x3de1b0,__buf_11,(size_t)__n);
    VTZWriter::write(writer,0x3a,__buf_12,(size_t)__n);
    VTZWriter::write(writer,(int)zonename,__buf_13,(size_t)__n);
    VTZWriter::write(writer,0x3de20e,__buf_14,(size_t)__n);
    VTZWriter::write(writer,0x3de1a0,__buf_15,(size_t)__n);
    VTZWriter::write(writer,0x3a,__buf_16,(size_t)__n);
    pUVar2 = getDateTimeString((double)dstr.fUnion._48_8_ + (double)fromOffset,
                               (UnicodeString *)local_78);
    VTZWriter::write(writer,(int)pUVar2,__buf_17,(size_t)__n);
    VTZWriter::write(writer,0x3de20e,__buf_18,(size_t)__n);
    UnicodeString::~UnicodeString((UnicodeString *)local_78);
  }
  return;
}

Assistant:

void
VTimeZone::beginZoneProps(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                          int32_t fromOffset, int32_t toOffset, UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BEGIN);
    writer.write(COLON);
    if (isDst) {
        writer.write(ICAL_DAYLIGHT);
    } else {
        writer.write(ICAL_STANDARD);
    }
    writer.write(ICAL_NEWLINE);

    UnicodeString dstr;

    // TZOFFSETTO
    writer.write(ICAL_TZOFFSETTO);
    writer.write(COLON);
    millisToOffset(toOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZOFFSETFROM
    writer.write(ICAL_TZOFFSETFROM);
    writer.write(COLON);
    millisToOffset(fromOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZNAME
    writer.write(ICAL_TZNAME);
    writer.write(COLON);
    writer.write(zonename);
    writer.write(ICAL_NEWLINE);
    
    // DTSTART
    writer.write(ICAL_DTSTART);
    writer.write(COLON);
    writer.write(getDateTimeString(startTime + fromOffset, dstr));
    writer.write(ICAL_NEWLINE);        
}